

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void logger_file(char *line)

{
  IOHANDLE in_RDI;
  IOHANDLE buffer;
  
  buffer = logfile;
  str_length((char *)0x253f4c);
  io_write(in_RDI,buffer,0);
  io_write_newline((IOHANDLE)0x253f68);
  io_flush((IOHANDLE)0x253f74);
  return;
}

Assistant:

static void logger_file(const char *line)
{
	io_write(logfile, line, str_length(line));
	io_write_newline(logfile);
	io_flush(logfile);
}